

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
Variable_validVariableName_Test::Variable_validVariableName_Test
          (Variable_validVariableName_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_001384b0;
  return;
}

Assistant:

TEST(Variable, validVariableName)
{
    const std::string in = "valid_name";
    const std::string e = in;
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setName(in);
    const std::string a = v->name();
    EXPECT_EQ(e, a);
}